

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

int Vec_IntTwoFindCommon(Vec_Int_t *vArr1,Vec_Int_t *vArr2,Vec_Int_t *vArr)

{
  int *piVar1;
  int *piVar2;
  int Entry;
  long lVar3;
  long extraout_RAX;
  int *piVar4;
  int *piVar5;
  
  piVar4 = vArr1->pArray;
  piVar5 = vArr2->pArray;
  piVar1 = piVar4 + vArr1->nSize;
  lVar3 = (long)vArr2->nSize;
  piVar2 = piVar5 + lVar3;
  vArr->nSize = 0;
LAB_005e80d8:
  do {
    if ((piVar1 <= piVar4) || (piVar2 <= piVar5)) {
      return (int)lVar3;
    }
    Entry = *piVar4;
    if (Entry == *piVar5) {
      Vec_IntPush(vArr,Entry);
      piVar4 = piVar4 + 1;
      lVar3 = extraout_RAX;
    }
    else if (Entry < *piVar5) {
      piVar4 = piVar4 + 1;
      goto LAB_005e80d8;
    }
    piVar5 = piVar5 + 1;
  } while( true );
}

Assistant:

static inline int Vec_IntTwoFindCommon( Vec_Int_t * vArr1, Vec_Int_t * vArr2, Vec_Int_t * vArr )
{
    int * pBeg1 = vArr1->pArray;
    int * pBeg2 = vArr2->pArray;
    int * pEnd1 = vArr1->pArray + vArr1->nSize;
    int * pEnd2 = vArr2->pArray + vArr2->nSize;
    Vec_IntClear( vArr );
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            Vec_IntPush( vArr, *pBeg1 ), pBeg1++, pBeg2++;
        else if ( *pBeg1 < *pBeg2 )
            pBeg1++;
        else 
            pBeg2++;
    }
    return Vec_IntSize(vArr);
}